

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_symmetr.c
# Opt level: O1

void pnga_symmetrize(Integer g_a)

{
  size_t __n;
  undefined1 auVar1 [16];
  long lVar2;
  Integer proc;
  Integer IVar3;
  logical lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Integer ndim;
  DoublePrecision *B;
  void *a_ptr;
  Integer alo [7];
  Integer ahi [7];
  Integer type;
  Integer bhi [7];
  Integer blo [7];
  Integer dims [7];
  Integer ldb [7];
  Integer lda [7];
  long local_208;
  double *local_200;
  undefined8 uStack_1f8;
  long local_1f0;
  Integer local_1e8 [6];
  long alStack_1b8 [2];
  Integer local_1a8;
  long local_1a0 [5];
  undefined1 auStack_178 [8];
  long local_170;
  Integer local_168 [8];
  Integer local_128 [6];
  long alStack_f8 [2];
  Integer local_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  proc = pnga_nodeid();
  iVar8 = _ga_sync_end;
  local_1f0 = 0;
  bVar18 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar18) {
    pnga_sync();
  }
  IVar3 = pnga_total_blocks(g_a);
  pnga_inquire(g_a,&local_170,&local_208,local_e8);
  if (local_170 != 0x3ec) {
    pnga_error("ga_symmetrize: only implemented for double precision",0);
  }
  if (IVar3 < 0) {
    if (alStack_f8[local_208 + 1] != alStack_f8[local_208]) {
      pnga_error("ga_sym: can only sym square matrix",0);
    }
    pnga_distribution(g_a,proc,local_1e8,&local_1a8);
    bVar18 = 0 < local_1a8;
    if (1 < local_208) {
      lVar6 = 1;
      do {
        if (bVar18) {
          bVar18 = 0 < (&local_1a8)[lVar6];
        }
        else {
          bVar18 = false;
        }
        lVar6 = lVar6 + 1;
      } while (local_208 != lVar6);
    }
    if (bVar18) {
      pnga_access_ptr(g_a,local_1e8,&local_1a8,&local_1f0,local_68);
      lVar6 = 1;
      if (0 < local_208) {
        lVar7 = 0;
        do {
          lVar6 = lVar6 * (((&local_1a8)[lVar7] - local_1e8[lVar7]) + 1);
          lVar7 = lVar7 + 1;
        } while (local_208 != lVar7);
      }
      local_200 = (double *)pnga_malloc(lVar6,0x3f5,"v");
      lVar7 = local_208;
      if (2 < local_208) {
        __n = local_208 * 8 - 0x10;
        memcpy(local_168,&local_1a8,__n);
        memcpy(local_128,local_1e8,__n);
      }
      auVar1 = *(undefined1 (*) [16])(&uStack_1f8 + lVar7);
      auVar19._0_8_ = auVar1._8_8_;
      auVar19._8_4_ = auVar1._0_4_;
      auVar19._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])(local_128 + lVar7 + -2) = auVar19;
      auVar1 = *(undefined1 (*) [16])(alStack_1b8 + lVar7);
      auVar20._0_8_ = auVar1._8_8_;
      auVar20._8_4_ = auVar1._0_4_;
      auVar20._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])(auStack_178 + lVar7 * 8) = auVar20;
      if (1 < lVar7) {
        lVar5 = 0;
        do {
          local_a8[lVar5] = (local_168[lVar5] - local_128[lVar5]) + 1;
          lVar5 = lVar5 + 1;
        } while (lVar7 + -1 != lVar5);
      }
      pnga_get(g_a,local_128,local_168,local_200,local_a8);
    }
    else {
      lVar6 = 1;
      local_200 = (double *)0x0;
    }
    pnga_sync();
    if (bVar18) {
      uStack_1f8._4_4_ = iVar8;
      lVar5 = 1;
      lVar7 = 1;
      if (2 < local_208) {
        lVar9 = 0;
        do {
          lVar10 = ((&local_1a8)[lVar9] - local_1e8[lVar9]) + 1;
          lVar5 = lVar5 * lVar10;
          lVar7 = lVar7 * lVar10;
          lVar9 = lVar9 + 1;
        } while (local_208 + -2 != lVar9);
      }
      if (0 < lVar7) {
        lVar10 = (alStack_1b8[local_208] - (&uStack_1f8)[local_208]) + 1;
        lVar9 = ((alStack_1b8[local_208 + 1] - local_1e8[local_208 + -1]) + 1) * lVar10;
        lVar11 = 0;
        pdVar12 = local_200;
        do {
          if (0 < lVar9) {
            lVar17 = 0;
            pdVar13 = pdVar12;
            lVar14 = lVar9;
            lVar16 = lVar11;
            do {
              lVar15 = (lVar17 + 1) * lVar7 + lVar11;
              lVar2 = lVar17 + 1;
              if (lVar16 < lVar6) {
                lVar15 = lVar16;
                lVar2 = lVar17;
              }
              lVar17 = lVar2;
              *(double *)(local_1f0 + lVar15 * 8) =
                   (*(double *)(local_1f0 + lVar15 * 8) + *pdVar13) * 0.5;
              lVar16 = lVar15 + lVar5 * lVar10;
              pdVar13 = pdVar13 + lVar7;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          lVar11 = lVar11 + 1;
          pdVar12 = pdVar12 + 1;
        } while (lVar11 != lVar7);
      }
      pnga_release_update(g_a,local_1e8,&local_1a8);
      pnga_free(local_200);
      iVar8 = uStack_1f8._4_4_;
    }
  }
  else {
    local_1a8 = 0x3fe0000000000000;
    lVar4 = pnga_duplicate(g_a,local_1e8,"A_transpose");
    if (lVar4 == 0) {
      pnga_error("ga_symmetrize: duplicate failed",0);
    }
    pnga_transpose(g_a,local_1e8[0]);
    pnga_add(&local_1a8,g_a,&local_1a8,local_1e8[0],g_a);
    pnga_destroy(local_1e8[0]);
  }
  if (iVar8 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_symmetrize(Integer g_a) {
  
  DoublePrecision alpha = 0.5;
  Integer i, me = pnga_nodeid();
  Integer alo[GA_MAX_DIM], ahi[GA_MAX_DIM], lda[GA_MAX_DIM], nelem=1;
  Integer blo[GA_MAX_DIM], bhi[GA_MAX_DIM], ldb[GA_MAX_DIM];
  Integer ndim, dims[GA_MAX_DIM], type;
  Logical have_data;
  Integer g_b; /* temporary global array (b = A') */
  Integer num_blocks_a;
  void *a_ptr=NULL, *b_ptr=NULL;
  int local_sync_begin,local_sync_end;
  char *tempB = "A_transpose";

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  
  num_blocks_a = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, dims);

  if (type != C_DBL)
    pnga_error("ga_symmetrize: only implemented for double precision",0);

  if (num_blocks_a < 0) {

    if (dims[ndim-1] != dims[ndim-2]) 
      pnga_error("ga_sym: can only sym square matrix", 0L);

    /* Find the local distribution */
    pnga_distribution(g_a, me, alo, ahi);


    have_data = ahi[0]>0;
    for(i=1; i<ndim; i++) have_data = have_data && ahi[i]>0;

    if(have_data) {
      pnga_access_ptr(g_a, alo, ahi, &a_ptr, lda); 

      for(i=0; i<ndim; i++) nelem *= ahi[i]-alo[i] +1;
      b_ptr = (void *) pnga_malloc(nelem, MT_F_DBL, "v");

      for(i=0; i<ndim-2; i++) {bhi[i]=ahi[i]; blo[i]=alo[i]; }

      /* switch rows and cols */
      blo[ndim-1]=alo[ndim-2];
      bhi[ndim-1]=ahi[ndim-2];
      blo[ndim-2]=alo[ndim-1];
      bhi[ndim-2]=ahi[ndim-1];

      for (i=0; i < ndim-1; i++) 
        ldb[i] = bhi[i] - blo[i] + 1; 
      pnga_get(g_a, blo, bhi, b_ptr, ldb);
    }
    pnga_sync(); 

    if(have_data) {
      gai_add(alo, ahi, a_ptr, b_ptr, alpha, type, nelem, ndim);
      pnga_release_update(g_a, alo, ahi);
      pnga_free(b_ptr);
    }
  } else {
    /* For block-cyclic data, probably most efficient solution is to
       create duplicate copy, transpose it and add the results together */
    DoublePrecision half = 0.5;
    if (!pnga_duplicate(g_a, &g_b, tempB))
      pnga_error("ga_symmetrize: duplicate failed", 0L);
    pnga_transpose(g_a, g_b);
    pnga_add(&half, g_a, &half, g_b, g_a);
    pnga_destroy(g_b);
  }
  if(local_sync_end)pnga_sync();
}